

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O3

void on_evict_test_evict_cb(VMEMcache *cache,void *key,size_t key_size,void *arg)

{
  long lVar1;
  ulong extraout_RDX;
  ulong __n;
  
  *(long *)((long)arg + 0x118) = *(long *)((long)arg + 0x118) + 1;
  lVar1 = vmemcache_get();
  if (lVar1 < 0) {
    on_evict_test_evict_cb_cold_2();
  }
  else if (lVar1 == 0x100) {
    return;
  }
  on_evict_test_evict_cb_cold_1();
  *(long *)((long)arg + 0x110) = *(long *)((long)arg + 0x110) + 1;
  __n = extraout_RDX;
  if (*(ulong *)((long)arg + 0x100) < extraout_RDX) {
    __n = *(ulong *)((long)arg + 0x100);
  }
  memcpy(arg,key,__n);
  *(ulong *)((long)arg + 0x108) = __n;
  return;
}

Assistant:

static void
on_evict_test_evict_cb(VMEMcache *cache, const void *key, size_t key_size,
		void *arg)
{
	struct ctx_cb *ctx = arg;
	ssize_t ret;

	ctx->evict_count++;

	ret = vmemcache_get(cache, key, key_size, ctx->vbuf, ctx->vbufsize, 0,
				&ctx->vsize);
	if (ret < 0)
		UT_FATAL("vmemcache_get");

	if ((size_t)ret != VSIZE)
		UT_FATAL(
			"vmemcache_get: wrong return value: %zi (should be %i)",
			ret, VSIZE);
}